

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChNodeFEAxyzrot.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChNodeFEAxyzrot::NodeIntLoadResidual_F
          (ChNodeFEAxyzrot *this,uint off,ChVectorDynamic<> *R,double c)

{
  undefined1 *this_00;
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  Index index_1;
  double *pdVar7;
  Index index;
  ulong uVar8;
  ulong uVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  ChVector<double> v;
  double local_58 [4];
  ulong local_38;
  double local_30;
  ulong local_28;
  
  this_00 = &(this->super_ChNodeFEAbase).field_0x18;
  local_58[3] = c;
  ChFrameMoving<double>::GetWvel_loc((ChFrameMoving<double> *)this_00);
  ChFrameMoving<double>::GetWvel_loc((ChFrameMoving<double> *)this_00);
  if ((long)(ulong)off <=
      (R->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows + -3) {
    auVar13._8_8_ = 0;
    auVar13._0_8_ = local_38;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = (this->variables).inertia.super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[0];
    auVar10._8_8_ = 0;
    auVar10._0_8_ =
         local_30 *
         *(double *)
          ((long)(this->variables).inertia.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
          + 8);
    auVar1 = vfmadd231sd_fma(auVar10,auVar13,auVar1);
    auVar15._8_8_ = 0;
    auVar15._0_8_ = local_28;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = *(double *)
                    ((long)(this->variables).inertia.super_Matrix<double,_3,_3,_1,_3,_3>.
                           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                           m_data.array + 0x10);
    auVar1 = vfmadd231sd_fma(auVar1,auVar15,auVar2);
    auVar3._8_8_ = 0;
    auVar3._0_8_ = *(double *)
                    ((long)(this->variables).inertia.super_Matrix<double,_3,_3,_1,_3,_3>.
                           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                           m_data.array + 0x18);
    auVar11._8_8_ = 0;
    auVar11._0_8_ =
         local_30 *
         *(double *)
          ((long)(this->variables).inertia.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
          + 0x20);
    auVar2 = vfmadd231sd_fma(auVar11,auVar13,auVar3);
    auVar4._8_8_ = 0;
    auVar4._0_8_ = *(double *)
                    ((long)(this->variables).inertia.super_Matrix<double,_3,_3,_1,_3,_3>.
                           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                           m_data.array + 0x28);
    auVar2 = vfmadd231sd_fma(auVar2,auVar15,auVar4);
    auVar5._8_8_ = 0;
    auVar5._0_8_ = *(double *)
                    ((long)(this->variables).inertia.super_Matrix<double,_3,_3,_1,_3,_3>.
                           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                           m_data.array + 0x30);
    auVar12._8_8_ = 0;
    auVar12._0_8_ =
         local_30 *
         *(double *)
          ((long)(this->variables).inertia.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
          + 0x38);
    auVar3 = vfmadd231sd_fma(auVar12,auVar13,auVar5);
    auVar6._8_8_ = 0;
    auVar6._0_8_ = *(double *)
                    ((long)(this->variables).inertia.super_Matrix<double,_3,_3,_1,_3,_3>.
                           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                           m_data.array + 0x40);
    auVar3 = vfmadd231sd_fma(auVar3,auVar15,auVar6);
    auVar14._8_8_ = 0;
    auVar14._0_8_ = local_58[0];
    auVar17._8_8_ = 0;
    auVar17._0_8_ = local_58[1];
    auVar16._8_8_ = 0;
    auVar16._0_8_ = local_58[2];
    pdVar7 = (R->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data +
             off;
    uVar8 = 3;
    if ((((ulong)pdVar7 & 7) == 0) &&
       (uVar9 = (ulong)(-((uint)((ulong)pdVar7 >> 3) & 0x1fffffff) & 7), uVar9 < 3)) {
      uVar8 = uVar9;
    }
    if (uVar8 != 0) {
      uVar9 = 0;
      do {
        pdVar7[uVar9] = local_58[3] * (this->Force).m_data[uVar9] + pdVar7[uVar9];
        uVar9 = uVar9 + 1;
      } while (uVar8 != uVar9);
    }
    auVar20._8_8_ = 0;
    auVar20._0_8_ = auVar2._0_8_ * local_58[2];
    auVar4 = vfmsub213sd_fma(auVar3,auVar17,auVar20);
    auVar19._8_8_ = 0;
    auVar19._0_8_ = auVar3._0_8_ * local_58[0];
    auVar3 = vfmsub213sd_fma(auVar1,auVar16,auVar19);
    auVar18._8_8_ = 0;
    auVar18._0_8_ = auVar1._0_8_ * local_58[1];
    auVar1 = vfmsub213sd_fma(auVar2,auVar14,auVar18);
    if (uVar8 < 3) {
      do {
        pdVar7[uVar8] = local_58[3] * (this->Force).m_data[uVar8] + pdVar7[uVar8];
        uVar8 = uVar8 + 1;
      } while (uVar8 != 3);
    }
    local_58[0] = (this->Torque).m_data[0] - auVar4._0_8_;
    local_58[1] = (this->Torque).m_data[1] - auVar3._0_8_;
    local_58[2] = (this->Torque).m_data[2] - auVar1._0_8_;
    if ((long)(ulong)(off + 3) <=
        (R->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows + -3) {
      pdVar7 = (R->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
               + (off + 3);
      uVar8 = 3;
      if ((((ulong)pdVar7 & 7) == 0) &&
         (uVar9 = (ulong)(-((uint)((ulong)pdVar7 >> 3) & 0x1fffffff) & 7), uVar9 < 3)) {
        uVar8 = uVar9;
      }
      if (uVar8 != 0) {
        uVar9 = 0;
        do {
          pdVar7[uVar9] = local_58[3] * local_58[uVar9] + pdVar7[uVar9];
          uVar9 = uVar9 + 1;
        } while (uVar8 != uVar9);
      }
      if (uVar8 < 3) {
        do {
          pdVar7[uVar8] = local_58[3] * local_58[uVar8] + pdVar7[uVar8];
          uVar8 = uVar8 + 1;
        } while (uVar8 != 3);
      }
      return;
    }
  }
  __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,
                "Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
               );
}

Assistant:

void ChNodeFEAxyzrot::NodeIntLoadResidual_F(const unsigned int off, ChVectorDynamic<>& R, const double c) {
    ChVector<> gyro = Vcross(this->GetWvel_loc(), (variables.GetBodyInertia() * this->GetWvel_loc()));

    R.segment(off + 0, 3) += c * Force.eigen();
    R.segment(off + 3, 3) += c * (Torque - gyro).eigen();
}